

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::remove_all_callbacks(void)

{
  bool bVar1;
  reference pCVar2;
  Callback *callback;
  iterator __end1;
  iterator __begin1;
  CallbackVec *__range1;
  lock_guard<std::recursive_mutex> lock;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&__range1,(mutex_type *)s_mutex);
  __end1 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                     ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  callback = (Callback *)
             std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                *)&callback);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
             ::operator*(&__end1);
    if (pCVar2->close != (close_handler_t)0x0) {
      (*pCVar2->close)(pCVar2->user_data);
    }
    __gnu_cxx::
    __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
    ::operator++(&__end1);
  }
  std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::clear
            ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  on_callback_change();
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&__range1);
  return;
}

Assistant:

void remove_all_callbacks()
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		for (auto& callback : s_callbacks) {
			if (callback.close) {
				callback.close(callback.user_data);
			}
		}
		s_callbacks.clear();
		on_callback_change();
	}